

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QString * QtPrivate::QStringList_join(QStringList *list,QLatin1StringView sep)

{
  QLatin1StringView s;
  bool bVar1;
  const_iterator *this;
  QList<QString> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *result;
  const_iterator it;
  const_iterator end;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  QList<QString> *list_00;
  QString *asize;
  const_iterator local_28;
  const_iterator local_20;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDI;
  QString::QString((QString *)0x1edd91);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x1edd9b);
  if (!bVar1) {
    list_00 = in_RSI;
    QLatin1StringView::size(&local_18);
    accumulatedSize(list_00,CONCAT17(uVar2,in_stack_ffffffffffffffa8));
    QString::reserve(in_RDI,(qsizetype)asize);
    local_20.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QString>::end(in_RSI);
    local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QString>::begin(in_RSI);
    QList<QString>::const_iterator::operator*(&local_28);
    QString::operator+=((QString *)in_RSI,in_stack_ffffffffffffff88);
    while( true ) {
      this = QList<QString>::const_iterator::operator++(&local_28);
      bVar1 = QList<QString>::const_iterator::operator!=(this,local_20);
      if (!bVar1) break;
      s.m_size._0_7_ = in_stack_ffffffffffffffa8;
      s.m_data = (char *)in_RDI;
      s.m_size._7_1_ = uVar2;
      QString::operator+=(in_stack_ffffffffffffff88,s);
      QList<QString>::const_iterator::operator*(&local_28);
      QString::operator+=((QString *)in_RSI,in_stack_ffffffffffffff88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList &list, QLatin1StringView sep)
{
    QString result;
    if (!list.isEmpty()) {
        result.reserve(accumulatedSize(list, sep.size()));
        const auto end = list.end();
        auto it = list.begin();
        result += *it;
        while (++it != end) {
            result += sep;
            result += *it;
        }
    }
    return result;
}